

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.cc
# Opt level: O0

void __thiscall webrtc::Resampler::~Resampler(Resampler *this)

{
  Resampler *pRVar1;
  Resampler *this_local;
  
  if (this->state1_ != (void *)0x0) {
    free(this->state1_);
  }
  if (this->state2_ != (void *)0x0) {
    free(this->state2_);
  }
  if (this->state3_ != (void *)0x0) {
    free(this->state3_);
  }
  if (this->in_buffer_ != (int16_t *)0x0) {
    free(this->in_buffer_);
  }
  if (this->out_buffer_ != (int16_t *)0x0) {
    free(this->out_buffer_);
  }
  if ((this->slave_left_ != (Resampler *)0x0) &&
     (pRVar1 = this->slave_left_, pRVar1 != (Resampler *)0x0)) {
    ~Resampler(pRVar1);
    operator_delete(pRVar1);
  }
  if ((this->slave_right_ != (Resampler *)0x0) &&
     (pRVar1 = this->slave_right_, pRVar1 != (Resampler *)0x0)) {
    ~Resampler(pRVar1);
    operator_delete(pRVar1);
  }
  return;
}

Assistant:

Resampler::~Resampler()
{
    if (state1_)
    {
        free(state1_);
    }
    if (state2_)
    {
        free(state2_);
    }
    if (state3_)
    {
        free(state3_);
    }
    if (in_buffer_)
    {
        free(in_buffer_);
    }
    if (out_buffer_)
    {
        free(out_buffer_);
    }
    if (slave_left_)
    {
        delete slave_left_;
    }
    if (slave_right_)
    {
        delete slave_right_;
    }
}